

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpPrepass::OnNameEntry
          (BinaryReaderObjdumpPrepass *this,NameSectionSubsection type,Index index,string_view name)

{
  long lVar1;
  
  if (type == Global) {
    lVar1 = 0x60;
  }
  else {
    if (type != Table) {
      return (Result)Ok;
    }
    lVar1 = 0x120;
  }
  ObjdumpNames::Set((ObjdumpNames *)
                    ((long)&(((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                            code_relocations).
                            super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar1),index,name);
  return (Result)Ok;
}

Assistant:

Result OnNameEntry(NameSectionSubsection type,
                     Index index,
                     string_view name) override {
    switch (type) {
      // TODO(sbc): remove OnFunctionName in favor of just using
      // OnNameEntry so that this works
      /*
      case NameSectionSubsection::Function:
        SetFunctionName(index, name);
        break;
      */
      case NameSectionSubsection::Global:
        SetGlobalName(index, name);
        break;
      case NameSectionSubsection::Table:
        SetTableName(index, name);
        break;
      default:
        break;
    }
    return Result::Ok;
  }